

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase84::run(TestCase84 *this)

{
  bool bVar1;
  MonotonicClock *pMVar2;
  MonotonicClock *pMVar3;
  Quantity<long,_kj::_::NanosecondLabel> local_e0;
  bool local_d1;
  undefined8 uStack_d0;
  bool _kj_shouldLog_1;
  Quantity<long,_kj::_::NanosecondLabel> local_c8;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_c0;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *local_b8;
  undefined1 local_b0 [8];
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
  _kjCondition_1;
  bool local_79;
  bool _kj_shouldLog;
  Quantity<long,_kj::_::NanosecondLabel> local_70;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_68;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *local_60;
  undefined1 local_58 [8];
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
  _kjCondition;
  TimePoint c;
  TimePoint p;
  MonotonicClock *precise;
  MonotonicClock *coarse;
  TestCase84 *this_local;
  
  pMVar2 = systemCoarseMonotonicClock();
  pMVar3 = systemPreciseMonotonicClock();
  c.value.value = (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)pMVar3)();
  _kjCondition._32_8_ = (*(code *)**(undefined8 **)pMVar2)();
  local_60 = (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&c);
  local_70 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                       (0x28,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
  local_68 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator+
                       ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                        &_kjCondition.result,&local_70);
  kj::_::DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
  ::operator<((DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
               *)local_58,
              (DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
               *)&local_60,&local_68);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    local_79 = kj::_::Debug::shouldLog(ERROR);
    while (local_79 != false) {
      _kjCondition_1._32_8_ =
           Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                     (&c,(Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                         &_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time-test.c++"
                 ,0x5f,ERROR,
                 "\"failed: expected \" \"p < c + 40 * kj::MILLISECONDS\", _kjCondition, p - c",
                 (char (*) [47])"failed: expected p < c + 40 * kj::MILLISECONDS",
                 (DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
                  *)local_58,(Quantity<long,_kj::_::NanosecondLabel> *)&_kjCondition_1.result);
      local_79 = false;
    }
  }
  local_b8 = (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&c);
  uStack_d0 = 1000000;
  local_c8 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                       (0x28,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
  local_c0 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                       ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                        &_kjCondition.result,&local_c8);
  kj::_::DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
  ::operator>((DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
               *)local_b0,
              (DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
               *)&local_b8,&local_c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    local_d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      local_e0 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                           ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                             *)&_kjCondition.result,&c);
      kj::_::Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time-test.c++"
                 ,0x60,ERROR,
                 "\"failed: expected \" \"p > c - 40 * kj::MILLISECONDS\", _kjCondition, c - p",
                 (char (*) [47])"failed: expected p > c - 40 * kj::MILLISECONDS",
                 (DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
                  *)local_b0,&local_e0);
      local_d1 = false;
    }
  }
  return;
}

Assistant:

TEST(Memory, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}